

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_agents.c
# Opt level: O3

REF_STATUS
ref_agents_push(REF_AGENTS ref_agents,REF_INT node,REF_INT part,REF_INT seed,REF_DBL *xyz,
               REF_INT *id_ptr)

{
  uint uVar1;
  undefined8 in_RAX;
  REF_AGENT_STRUCT *pRVar2;
  long lVar3;
  REF_INT id;
  int local_34;
  
  local_34 = (int)((ulong)in_RAX >> 0x20);
  uVar1 = ref_agents_new(ref_agents,&local_34);
  if (uVar1 == 0) {
    *id_ptr = local_34;
    pRVar2 = ref_agents->agent + local_34;
    pRVar2->mode = REF_AGENT_WALKING;
    pRVar2->home = ref_agents->ref_mpi->id;
    pRVar2->node = node;
    pRVar2->part = part;
    pRVar2->seed = seed;
    pRVar2->global = -1;
    pRVar2->step = 0;
    uVar1 = 0;
    lVar3 = 0;
    do {
      pRVar2->xyz[lVar3] = xyz[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_agents.c",0xa7,
           "ref_agents_push",(ulong)uVar1,"new");
  }
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_agents_push(REF_AGENTS ref_agents, REF_INT node,
                                   REF_INT part, REF_INT seed, REF_DBL *xyz,
                                   REF_INT *id_ptr) {
  REF_INT i, id;

  RSS(ref_agents_new(ref_agents, &id), "new");
  *id_ptr = id;

  ref_agent_mode(ref_agents, id) = REF_AGENT_WALKING;
  ref_agent_home(ref_agents, id) = ref_mpi_rank(ref_agents->ref_mpi);
  ref_agent_node(ref_agents, id) = node;
  ref_agent_part(ref_agents, id) = part;
  ref_agent_seed(ref_agents, id) = seed;
  ref_agent_global(ref_agents, id) = REF_EMPTY;
  ref_agent_step(ref_agents, id) = 0;
  for (i = 0; i < 3; i++) ref_agent_xyz(ref_agents, i, id) = xyz[i];

  return REF_SUCCESS;
}